

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_outputParameterSucceeds_TestShell::
~TEST_MockParameterTest_outputParameterSucceeds_TestShell
          (TEST_MockParameterTest_outputParameterSucceeds_TestShell *this)

{
  TEST_MockParameterTest_outputParameterSucceeds_TestShell *this_local;
  
  ~TEST_MockParameterTest_outputParameterSucceeds_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, outputParameterSucceeds)
{
    int param = 1;
    int retval = 2;

    mock().expectOneCall("function").withOutputParameterReturning("parameterName", &retval, sizeof(retval));
    mock().actualCall("function").withOutputParameter("parameterName", &param);

    CHECK_EQUAL(param, 2);
    CHECK_EQUAL(retval, 2);
    mock().checkExpectations();
}